

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib651.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  int local_3c;
  int size;
  int i;
  curl_httppost *lastptr;
  curl_httppost *formpost;
  CURLFORMcode formrc;
  CURLcode res;
  CURL *curl;
  char *URL_local;
  
  formpost._4_4_ = 0;
  lastptr = (curl_httppost *)0x0;
  _size = 0;
  curl = (CURL *)URL;
  for (local_3c = 0; local_3c < 0x11; local_3c = local_3c + 1) {
    memset(buffer + local_3c * 1000,local_3c + 0x41U & 0xff,1000);
  }
  buffer[16999] = '\0';
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    formpost._0_4_ = curl_formadd(&lastptr,&size,1,"hello",4,buffer,0x11);
    if ((int)formpost != 0) {
      curl_mprintf("curl_formadd(1) = %d\n",(int)formpost);
    }
    _formrc = curl_easy_init();
    if (_formrc == 0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      curl_formfree(lastptr);
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      formpost._4_4_ = curl_easy_setopt(_formrc,0x2712,curl);
      if ((((formpost._4_4_ == 0) &&
           (formpost._4_4_ = curl_easy_setopt(_formrc,0x2728,lastptr), formpost._4_4_ == 0)) &&
          (formpost._4_4_ = curl_easy_setopt(_formrc,0x29,1), formpost._4_4_ == 0)) &&
         (formpost._4_4_ = curl_easy_setopt(_formrc,0x2a,1), formpost._4_4_ == 0)) {
        formpost._4_4_ = curl_easy_perform(_formrc);
      }
      curl_easy_cleanup(_formrc);
      curl_formfree(lastptr);
      curl_global_cleanup();
      URL_local._4_4_ = formpost._4_4_;
    }
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *curl;
  CURLcode res = CURLE_OK;
  CURLFORMcode formrc;
  struct curl_httppost *formpost = NULL;
  struct curl_httppost *lastptr = NULL;

  /* create a buffer with AAAA...BBBBB...CCCC...etc */
  int i;
  int size = (int)sizeof(buffer)/1000;

  for(i = 0; i < size ; i++)
    memset(&buffer[i * 1000], 65 + i, 1000);

  buffer[ sizeof(buffer)-1] = 0; /* zero terminate */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  /* Check proper name and data copying. */
  formrc = curl_formadd(&formpost, &lastptr,
                        CURLFORM_COPYNAME, "hello",
                        CURLFORM_COPYCONTENTS, buffer,
                        CURLFORM_END);

  if(formrc)
    printf("curl_formadd(1) = %d\n", (int) formrc);


  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_formfree(formpost);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* First set the URL that is about to receive our POST. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* send a multi-part formpost */
  test_setopt(curl, CURLOPT_HTTPPOST, formpost);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(curl, CURLOPT_HEADER, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);

  /* now cleanup the formpost chain */
  curl_formfree(formpost);

  curl_global_cleanup();

  return res;
}